

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

ClippedEdge *
MutableS2ShapeIndex::ClipUBound(ClippedEdge *edge,int u_end,double u,EdgeAllocator *alloc)

{
  double dVar1;
  double dVar2;
  FaceEdge *pFVar3;
  ClippedEdge *pCVar4;
  double dVar5;
  double dVar6;
  S2LogMessage local_30;
  
  if (u_end == 0) {
    if (u <= (edge->bound).bounds_[0].bounds_.c_[0]) {
      return edge;
    }
  }
  else if ((edge->bound).bounds_[0].bounds_.c_[1] <= u) {
    return edge;
  }
  pFVar3 = edge->face_edge;
  dVar6 = (pFVar3->a).c_[0];
  dVar1 = (pFVar3->b).c_[0];
  if ((dVar6 == dVar1) && (!NAN(dVar6) && !NAN(dVar1))) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_clipping.h"
               ,0xab,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (a) != (b) ",0x19);
    abort();
  }
  dVar2 = (pFVar3->a).c_[1];
  dVar5 = (pFVar3->b).c_[1];
  if (ABS(dVar6 - u) <= ABS(dVar1 - u)) {
    dVar5 = ((u - dVar6) * (dVar5 - dVar2)) / (dVar1 - dVar6) + dVar2;
  }
  else {
    dVar5 = ((u - dVar1) * (dVar2 - dVar5)) / (dVar6 - dVar1) + dVar5;
  }
  dVar6 = R1Interval::Project((edge->bound).bounds_ + 1,dVar5);
  pCVar4 = UpdateBound(edge,u_end,u,
                       -(uint)((pFVar3->b).c_[1] < (pFVar3->a).c_[1] !=
                              (pFVar3->b).c_[0] < (pFVar3->a).c_[0]) & 1 ^ u_end,dVar6,alloc);
  return pCVar4;
}

Assistant:

const MutableS2ShapeIndex::ClippedEdge*
MutableS2ShapeIndex::ClipUBound(const ClippedEdge* edge, int u_end, double u,
                                EdgeAllocator* alloc) {
  // First check whether the edge actually requires any clipping.  (Sometimes
  // this method is called when clipping is not necessary, e.g. when one edge
  // endpoint is in the overlap area between two padded child cells.)
  if (u_end == 0) {
    if (edge->bound[0].lo() >= u) return edge;
  } else {
    if (edge->bound[0].hi() <= u) return edge;
  }
  // We interpolate the new v-value from the endpoints of the original edge.
  // This has two advantages: (1) we don't need to store the clipped endpoints
  // at all, just their bounding box; and (2) it avoids the accumulation of
  // roundoff errors due to repeated interpolations.  The result needs to be
  // clamped to ensure that it is in the appropriate range.
  const FaceEdge& e = *edge->face_edge;
  double v = edge->bound[1].Project(
      S2::InterpolateDouble(u, e.a[0], e.b[0], e.a[1], e.b[1]));

  // Determine which endpoint of the v-axis bound to update.  If the edge
  // slope is positive we update the same endpoint, otherwise we update the
  // opposite endpoint.
  int v_end = u_end ^ ((e.a[0] > e.b[0]) != (e.a[1] > e.b[1]));
  return UpdateBound(edge, u_end, u, v_end, v, alloc);
}